

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.cpp
# Opt level: O0

void __thiscall slang::IntervalMapDetails::Path::moveLeft(Path *this,uint32_t level)

{
  uint uVar1;
  bool bVar2;
  uint32_t uVar3;
  reference pEVar4;
  NodeRef *pNVar5;
  uint in_ESI;
  SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *in_RDI;
  NodeRef nodeRef;
  uint32_t l;
  ulong in_stack_ffffffffffffff98;
  Entry *in_stack_ffffffffffffffa8;
  NodeRef in_stack_ffffffffffffffb0;
  undefined8 local_48;
  void *local_38;
  undefined8 local_30;
  Entry *local_28;
  Entry local_20;
  uint local_10;
  uint local_c;
  
  local_10 = 0;
  local_c = in_ESI;
  bVar2 = valid((Path *)in_stack_ffffffffffffffb0.pip.value);
  uVar1 = local_c;
  if (bVar2) {
    do {
      local_10 = uVar1 - 1;
      pEVar4 = SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::operator[]
                         (in_RDI,(ulong)local_10);
      uVar1 = local_10;
    } while (pEVar4->offset == 0);
  }
  else {
    uVar3 = height((Path *)in_RDI);
    if (uVar3 < local_c) {
      in_stack_ffffffffffffff98 = (ulong)(local_c + 1);
      Entry::Entry(&local_20,(nullptr_t)0x0,0,0);
      SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::resize
                (in_RDI,in_stack_ffffffffffffff98,(Entry *)0xeb95b7);
    }
  }
  pEVar4 = SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::operator[]
                     (in_RDI,(ulong)local_10);
  pEVar4->offset = pEVar4->offset - 1;
  pNVar5 = childAt((Path *)in_stack_ffffffffffffffb0.pip.value,
                   (uint32_t)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
  local_28 = (Entry *)(pNVar5->pip).value;
  while (local_10 = local_10 + 1, local_10 != local_c) {
    NodeRef::size((NodeRef *)0xeb9611);
    Entry::Entry(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb0,
                 (uint32_t)((ulong)in_RDI >> 0x20));
    pEVar4 = SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::operator[]
                       (in_RDI,(ulong)local_10);
    pEVar4->node = local_38;
    pEVar4->size = (undefined4)local_30;
    pEVar4->offset = local_30._4_4_;
    NodeRef::size((NodeRef *)0xeb9650);
    pNVar5 = NodeRef::childAt((NodeRef *)in_RDI,(uint32_t)(in_stack_ffffffffffffff98 >> 0x20));
    local_28 = (Entry *)(pNVar5->pip).value;
  }
  NodeRef::size((NodeRef *)0xeb968b);
  Entry::Entry(local_28,in_stack_ffffffffffffffb0,(uint32_t)((ulong)in_RDI >> 0x20));
  pEVar4 = SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::operator[]
                     (in_RDI,(ulong)local_10);
  pEVar4->node = (void *)in_stack_ffffffffffffffb0.pip.value;
  pEVar4->size = (undefined4)local_48;
  pEVar4->offset = local_48._4_4_;
  return;
}

Assistant:

void Path::moveLeft(uint32_t level) {
    SLANG_ASSERT(level);

    // Go up the tree until we find a node where we can go left.
    uint32_t l = 0;
    if (valid()) {
        l = level - 1;
        while (path[l].offset == 0) {
            SLANG_ASSERT(l);
            --l;
        }
    }
    else if (height() < level) {
        path.resize(level + 1, Entry(nullptr, 0, 0));
    }

    --path[l].offset;

    // Get the rightmost node of the new subtree.
    NodeRef nodeRef = childAt(l);
    for (++l; l != level; ++l) {
        path[l] = Entry(nodeRef, nodeRef.size() - 1);
        nodeRef = nodeRef.childAt(nodeRef.size() - 1);
    }
    path[l] = Entry(nodeRef, nodeRef.size() - 1);
}